

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O3

bool __thiscall
gl3cts::ClipDistance::CoverageTest::MaxClipDistancesValueTest(CoverageTest *this,Functions *gl)

{
  ostringstream *poVar1;
  bool bVar2;
  GLenum GVar3;
  ContextType ctxType;
  int iVar4;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  (*gl->getIntegerv)(0xd32,&this->m_gl_max_clip_distances_value);
  GVar3 = (*gl->getError)();
  if (GVar3 == 0) {
    ctxType.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    bVar2 = glu::contextSupports(ctxType,(ApiType)0x113);
    iVar4 = (uint)bVar2 * 2 + 6;
    if (iVar4 <= this->m_gl_max_clip_distances_value) {
      return true;
    }
    local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Value of ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"GL_MAX_CLIP_DISTANCES",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"is equal to ",0xc);
    std::ostream::operator<<(poVar1,this->m_gl_max_clip_distances_value);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," which is less than minimum required (",0x26);
    std::ostream::operator<<(poVar1,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,").",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"glGetIntegerv(",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"GL_MAX_CLIP_DISTANCES",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,") returned error code ",0x16);
    local_1b0.m_getName = glu::getErrorName;
    local_1b0.m_value = GVar3;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," instead of GL_NO_ERROR.",0x18);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a0 + 8));
  std::ios_base::~ios_base(local_128);
  return false;
}

Assistant:

bool gl3cts::ClipDistance::CoverageTest::MaxClipDistancesValueTest(const glw::Functions& gl)
{
	/*  Check that calling GetIntegerv with GL_MAX_CLIP_DISTANCES doesn't
	 generate any errors and returns a value at least 6 in OpenGL 3.0
	 or 8 in OpenGL 3.1 and higher (see issues). */

	glw::GLint error_code = GL_NO_ERROR;

	gl.getIntegerv(GL_MAX_CLIP_DISTANCES, &m_gl_max_clip_distances_value);

	error_code = gl.getError();

	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glGetIntegerv(" << STR(GL_MAX_CLIP_DISTANCES)
						   << ") returned error code " << glu::getErrorStr(error_code) << " instead of GL_NO_ERROR."
						   << tcu::TestLog::EndMessage;

		return false;
	}
	else
	{
		glw::GLint gl_max_clip_distances_minimum_value = 6; /* OpenGL 3.0 Specification minimum value */

		if (glu::contextSupports(
				m_context.getRenderContext().getType(),
				glu::ApiType(3, 1, glu::PROFILE_CORE))) /* OpenGL 3.1 Specification minimum value, see bug #4803 */
		{
			gl_max_clip_distances_minimum_value = 8;
		}

		if (m_gl_max_clip_distances_value < gl_max_clip_distances_minimum_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Value of " << STR(GL_MAX_CLIP_DISTANCES) << "is equal to "
							   << m_gl_max_clip_distances_value << " which is less than minimum required ("
							   << gl_max_clip_distances_minimum_value << ")." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}